

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
kj::_::TupleImpl<kj::_::Indexes<0ul,1ul>,kj::String,kj::StringPtr>::
TupleImpl<kj::String,char_const*>
          (TupleImpl<kj::_::Indexes<0ul,1ul>,kj::String,kj::StringPtr> *this,
          Tuple<kj::String,_const_char_*> *other)

{
  TypeByIndex<0UL,_kj::String,_const_char_*> *t;
  String *value;
  TypeByIndex<1UL,_kj::String,_const_char_*> *t_00;
  char **ppcVar1;
  StringPtr local_28;
  Tuple<kj::String,_const_char_*> *local_18;
  Tuple<kj::String,_const_char_*> *other_local;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::String,_kj::StringPtr> *this_local;
  
  local_18 = other;
  other_local = (Tuple<kj::String,_const_char_*> *)this;
  t = getImpl<0ul,kj::String,char_const*>(other);
  value = fwd<kj::String>(t);
  TupleElement<0U,_kj::String>::TupleElement((TupleElement<0U,_kj::String> *)this,value);
  t_00 = getImpl<1ul,kj::String,char_const*>(local_18);
  ppcVar1 = fwd<char_const*>(t_00);
  StringPtr::StringPtr(&local_28,*ppcVar1);
  TupleElement<1U,_kj::StringPtr>::TupleElement
            ((TupleElement<1U,_kj::StringPtr> *)(this + 0x18),&local_28);
  return;
}

Assistant:

constexpr inline TupleImpl(Tuple<U...>&& other)
      : TupleElement<indexes, Types>(kj::fwd<U>(getImpl<indexes>(other)))... {}